

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmain.cpp
# Opt level: O0

void __thiscall CTcMain::check_error_limit(CTcMain *this)

{
  CTcTokFileDesc *linedesc;
  long linenum;
  CTcMain *in_RDI;
  
  if (in_RDI->max_error_count_ < in_RDI->error_count_) {
    in_RDI->max_error_count_ = in_RDI->error_count_ + 100;
    linedesc = CTcTokenizer::get_last_desc(G_tok);
    linenum = CTcTokenizer::get_last_linenum(G_tok);
    log_error(in_RDI,linedesc,linenum,TC_SEV_FATAL,0x296e);
    err_throw(0);
  }
  return;
}

Assistant:

void CTcMain::check_error_limit()
{
    /* check the error count against the limit */
    if (error_count_ > max_error_count_)
    {
        /* 
         *   raise the maximum error count a bit so that we don't encounter
         *   another maximum error situation and loop on flagging the
         *   too-many-errors error while trying to display a too-many-errors
         *   error 
         */
        max_error_count_ = error_count_ + 100;

        /* display a message explaining the problem */
        log_error(G_tok->get_last_desc(), G_tok->get_last_linenum(),
                  TC_SEV_FATAL, TCERR_TOO_MANY_ERRORS);

        /* throw the generic fatal error, since we've logged this */
        err_throw(TCERR_FATAL_ERROR);
    }
}